

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

wchar_t * __thiscall
ON_Locale::GetBCP47LanguageTag(ON_Locale *this,wchar_t *buffer,size_t buffer_capacity)

{
  char *cbuffer_00;
  wchar_t *pwVar1;
  char local_a8 [8];
  char cbuffer [128];
  size_t buffer_capacity_local;
  wchar_t *buffer_local;
  ON_Locale *this_local;
  
  cbuffer_00 = GetBCP47LanguageTag(this,local_a8,0x80);
  pwVar1 = LocalWideStringBuider(cbuffer_00,buffer,buffer_capacity);
  return pwVar1;
}

Assistant:

const wchar_t* ON_Locale::GetBCP47LanguageTag(
  wchar_t* buffer,
  size_t buffer_capacity
  ) const
{
  char cbuffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY];
  return (LocalWideStringBuider(
    GetBCP47LanguageTag(cbuffer,sizeof(cbuffer)/sizeof(cbuffer[0])),
    buffer,
    buffer_capacity
    ));
}